

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_rfc5444.c
# Opt level: O3

void oonf_rfc5444_send_target_data(oonf_rfc5444_target *target,void *ptr,size_t len)

{
  oonf_rfc5444_interface *poVar1;
  netaddr_socket sock;
  netaddr_socket local_a0;
  
  netaddr_socket_init(&local_a0,&target->dst,target->interface->protocol->port,
                      ((target->interface->_socket)._if_listener.data)->index);
  _print_packet_to_buffer
            (LOG_RFC5444_W,&local_a0,target->interface,(uint8_t *)ptr,len,
             "Outgoing RFC5444 packet to","Error while parsing outgoing RFC5444 packet to");
  if (_block_output == true) {
    if (((&log_global_mask)[_oonf_rfc5444_subsystem.logging] & 1) != 0) {
      oonf_log(1,(ulong)_oonf_rfc5444_subsystem.logging,"src/base/oonf_rfc5444.c",0x378,0,0,
               "Output blocked");
    }
  }
  else {
    poVar1 = target->interface;
    if ((poVar1->multicast4 == target) || (poVar1->multicast6 == target)) {
      oonf_packet_send_managed_multicast(&poVar1->_socket,ptr,len,(target->dst)._type);
    }
    else {
      oonf_packet_send_managed(&poVar1->_socket,&local_a0,ptr,len);
    }
  }
  return;
}

Assistant:

void
oonf_rfc5444_send_target_data(struct oonf_rfc5444_target *target, const void *ptr, size_t len) {
  union netaddr_socket sock;
  struct os_interface_listener *interf;

  interf = oonf_rfc5444_get_core_if_listener(target->interface);
  netaddr_socket_init(&sock, &target->dst, target->interface->protocol->port, interf->data->index);

  _print_packet_to_buffer(LOG_RFC5444_W, &sock, target->interface, ptr, len, "Outgoing RFC5444 packet to",
    "Error while parsing outgoing RFC5444 packet to");

  if (_block_output) {
    OONF_DEBUG(LOG_RFC5444, "Output blocked");
    return;
  }
  if (target == target->interface->multicast4 || target == target->interface->multicast6) {
    oonf_packet_send_managed_multicast(&target->interface->_socket, ptr, len, netaddr_get_address_family(&target->dst));
  }
  else {
    oonf_packet_send_managed(&target->interface->_socket, &sock, ptr, len);
  }
}